

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

void __thiscall vkt::anon_unknown_0::PixelValue::setValue(PixelValue *this,size_t ndx,bool value)

{
  byte bVar1;
  ushort uVar2;
  undefined7 in_register_00000011;
  
  bVar1 = (char)ndx * '\x02';
  uVar2 = (ushort)(1 << (bVar1 & 0x1f)) | this->m_status;
  if ((int)CONCAT71(in_register_00000011,value) == 0) {
    uVar2 = uVar2 & ~(ushort)(2 << (bVar1 & 0x1e));
  }
  else {
    uVar2 = uVar2 | (ushort)(2 << (bVar1 & 0x1f));
  }
  this->m_status = uVar2;
  return;
}

Assistant:

void PixelValue::setValue (size_t ndx, bool value)
{
	DE_ASSERT(ndx < 4);
	DE_ASSERT(m_status <= 0xFFu);

	m_status |= (deUint16)(0x1u << (ndx * 2));

	if (value)
		m_status |= (deUint16)(0x1u << (ndx * 2 + 1));
	else
		m_status &= (deUint16)~(0x1u << (deUint16)(ndx * 2 + 1));

	DE_ASSERT(m_status <= 0xFFu);
}